

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)

{
  FederateInfo *this;
  HelicsFederateInfo in_RDI;
  FederateInfo *info;
  HelicsError *in_stack_fffffffffffffff0;
  
  this = getFedInfo(in_RDI,in_stack_fffffffffffffff0);
  if ((this != (FederateInfo *)0x0) && (this->uniqueKey = 0, this != (FederateInfo *)0x0)) {
    helics::FederateInfo::~FederateInfo(this);
    operator_delete(this,0x1a8);
  }
  return;
}

Assistant:

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)
{
    auto* info = getFedInfo(fedInfo, nullptr);
    if (info == nullptr) {
        // fprintf(stderr, "The HelicsFederateInfo object is not valid\n");
        return;
    }
    info->uniqueKey = 0;
    delete info;
}